

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint32_t uVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_t sVar6;
  pool_ref<soul::heart::Variable> *ppVar7;
  pool_ref<soul::heart::Function> *ppVar8;
  int iVar9;
  Connection *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Module *pMVar10;
  Variable *v;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  pool_ref<soul::heart::InputDeclaration> *io;
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  long lVar15;
  ulong uVar16;
  pool_ref<soul::heart::Connection> local_38;
  
  uVar16 = (ulong)(uint)__flags;
  pMVar10 = this->oldModule;
  ppVar11 = (pMVar10->inputs).
            super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (pMVar10->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.object = in_RAX;
  if (ppVar11 != ppVar2) {
    do {
      pMVar10 = this->newModule;
      iVar9 = clone(this,(__fn *)ppVar11->object,__child_stack,(int)uVar16,__arg);
      local_38.object = (Connection *)CONCAT44(extraout_var,iVar9);
      std::
      vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::heart::InputDeclaration>>
                ((vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
                  *)&pMVar10->inputs,(pool_ref<soul::heart::InputDeclaration> *)&local_38);
      ppVar11 = ppVar11 + 1;
      __child_stack = extraout_RDX;
    } while (ppVar11 != ppVar2);
    pMVar10 = this->oldModule;
  }
  ppVar12 = (pMVar10->outputs).
            super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (pMVar10->outputs).
           super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 != ppVar3) {
    do {
      pMVar10 = this->newModule;
      iVar9 = clone(this,(__fn *)ppVar12->object,__child_stack,(int)uVar16,__arg);
      local_38.object = (Connection *)CONCAT44(extraout_var_00,iVar9);
      std::
      vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::heart::OutputDeclaration>>
                ((vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
                  *)&pMVar10->outputs,(pool_ref<soul::heart::OutputDeclaration> *)&local_38);
      ppVar12 = ppVar12 + 1;
      __child_stack = extraout_RDX_00;
    } while (ppVar12 != ppVar3);
    pMVar10 = this->oldModule;
  }
  if (pMVar10->moduleType == graphModule) {
    ppVar13 = (pMVar10->processorInstances).
              super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (pMVar10->processorInstances).
             super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar13 != ppVar4) {
      do {
        pMVar10 = this->newModule;
        iVar9 = clone(this,(__fn *)ppVar13->object,__child_stack,(int)uVar16,__arg);
        local_38.object = (Connection *)CONCAT44(extraout_var_01,iVar9);
        std::
        vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
        ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
                  ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
                    *)&pMVar10->processorInstances,
                   (pool_ref<soul::heart::ProcessorInstance> *)&local_38);
        ppVar13 = ppVar13 + 1;
        __child_stack = extraout_RDX_01;
      } while (ppVar13 != ppVar4);
      pMVar10 = this->oldModule;
    }
    ppVar14 = (pMVar10->connections).
              super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pMVar10->connections).
             super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar14 != ppVar5) {
      do {
        pMVar10 = this->newModule;
        iVar9 = clone(this,(__fn *)ppVar14->object,__child_stack,(int)uVar16,__arg);
        local_38.object = (Connection *)CONCAT44(extraout_var_02,iVar9);
        std::
        vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
        ::emplace_back<soul::pool_ref<soul::heart::Connection>>
                  ((vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
                    *)&pMVar10->connections,&local_38);
        ppVar14 = ppVar14 + 1;
        __child_stack = extraout_RDX_02;
      } while (ppVar14 != ppVar5);
      pMVar10 = this->oldModule;
    }
  }
  sVar6 = (pMVar10->stateVariables).stateVariables.numActive;
  if (sVar6 != 0) {
    ppVar7 = (pMVar10->stateVariables).stateVariables.items;
    lVar15 = 0;
    do {
      pMVar10 = this->newModule;
      v = getRemappedVariable(this,*(Variable **)((long)&ppVar7->object + lVar15));
      Module::StateVariables::add(&pMVar10->stateVariables,v);
      lVar15 = lVar15 + 8;
    } while (sVar6 << 3 != lVar15);
    pMVar10 = this->oldModule;
  }
  if ((pMVar10->functions).functions.numActive != 0) {
    uVar16 = 0;
    do {
      if ((this->newModule->functions).functions.numActive <= uVar16) {
        throwInternalCompilerError("index < numActive","operator[]",0x9f);
      }
      ppVar8 = (this->newModule->functions).functions.items;
      clone(this,(__fn *)ppVar8[uVar16].object,(pMVar10->functions).functions.items[uVar16].object,
            (int)ppVar8,__arg);
      uVar16 = uVar16 + 1;
      pMVar10 = this->oldModule;
    } while (uVar16 < (pMVar10->functions).functions.numActive);
  }
  uVar1 = pMVar10->latency;
  this->newModule->latency = uVar1;
  return uVar1;
}

Assistant:

void clone()
    {
        for (auto& io : oldModule.inputs)
            newModule.inputs.push_back (clone (io));

        for (auto& io : oldModule.outputs)
            newModule.outputs.push_back (clone (io));

        if (oldModule.isGraph())
        {
            for (auto& mi : oldModule.processorInstances)
                newModule.processorInstances.push_back (clone (mi));

            for (auto& c : oldModule.connections)
                newModule.connections.push_back (clone (c));
        }

        for (auto& v : oldModule.stateVariables.get())
            newModule.stateVariables.add (getRemappedVariable (v));

        for (size_t i = 0; i <  oldModule.functions.size(); ++i)
            clone (newModule.functions.at (i), oldModule.functions.at (i));

        newModule.latency = oldModule.latency;
    }